

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O2

Array * __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::resize_array
          (UnboundedTaskQueue<tf::Node_*> *this,Array *a,int64_t b,int64_t t)

{
  Array *pAVar1;
  Array *local_20;
  
  local_20 = a;
  pAVar1 = Array::resize(a,b,t);
  std::
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ::push_back(&this->_garbage,&local_20);
  (this->_array)._M_b._M_p = pAVar1;
  return pAVar1;
}

Assistant:

typename UnboundedTaskQueue<T>::Array*
UnboundedTaskQueue<T>::resize_array(Array* a, int64_t b, int64_t t) {

  //Array* tmp = a->resize(b, t);
  //_garbage.push_back(a);
  //std::swap(a, tmp);
  //_array.store(a, std::memory_order_release);
  //// Note: the original paper using relaxed causes t-san to complain
  ////_array.store(a, std::memory_order_relaxed);
  //return a;
  

  Array* tmp = a->resize(b, t);
  _garbage.push_back(a);
  _array.store(tmp, std::memory_order_release);
  // Note: the original paper using relaxed causes t-san to complain
  //_array.store(a, std::memory_order_relaxed);
  return tmp;
}